

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_sysprof.c
# Opt level: O1

int lj_sysprof_set_writer(luam_Sysprof_writer writer)

{
  int iVar1;
  
  iVar1 = 1;
  if ((writer != (luam_Sysprof_writer)0x0) && (sysprof.state == 0)) {
    iVar1 = 0;
    sysprof.writer = writer;
    if ((sysprof.backtracer != (luam_Sysprof_backtracer)0x0) &&
       (sysprof.on_stop != (luam_Sysprof_on_stop)0x0)) {
      sysprof.state = 0;
    }
  }
  return iVar1;
}

Assistant:

int lj_sysprof_set_writer(luam_Sysprof_writer writer) {
  struct sysprof *sp = &sysprof;

  if (sp->state != SPS_IDLE || writer == NULL)
    return PROFILE_ERRUSE;

  sp->writer = writer;
  if (!is_unconfigured(sp)) {
    sp->state = SPS_IDLE;
  }
  return PROFILE_SUCCESS;
}